

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O1

void __thiscall BufferedFileWriter::terminate(BufferedFileWriter *this)

{
  WriterData data;
  WriterData local_30;
  
  if (this->m_terminated == false) {
    this->m_terminated = true;
    local_30.m_buffer = (uint8_t *)0x0;
    local_30.m_bufferLen = 0;
    local_30.m_mainFile = (AbstractOutputStream *)0x0;
    local_30.m_command = wdNone;
    SafeQueueWithNotification<WriterData>::push
              (&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>,&local_30);
    if ((this->super_TerminatableThread).m_thread._M_id._M_thread != 0) {
      std::thread::join();
    }
  }
  return;
}

Assistant:

void BufferedFileWriter::terminate()
{
    if (m_terminated)
        return;
    m_terminated = true;
    WriterData data;
    data.m_command = WriterData::Commands::wdNone;
    m_writeQueue.push(data);
    join();
}